

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_instance.c
# Opt level: O0

apx_error_t
route_provide_port_data_change_to_receivers
          (apx_nodeInstance_t *self,uint32_t provide_data_offset,uint8_t *provide_data,
          apx_size_t provide_data_size)

{
  apx_portConnectorList_t *paVar1;
  apx_portId_t port_id;
  uint32_t size;
  int32_t iVar2;
  uint32_t uVar3;
  apx_portInstance_t *self_00;
  apx_portInstance_t *self_01;
  apx_size_t require_data_offset;
  apx_size_t require_port_data_size;
  apx_portInstance_t *require_port;
  int local_48;
  apx_size_t provide_port_data_size;
  int32_t connector_id;
  int32_t num_connectors;
  apx_portConnectorList_t *port_connectors;
  apx_portInstance_t *provide_port;
  apx_portId_t provide_port_id;
  uint32_t end_offset;
  apx_error_t retval;
  apx_size_t provide_data_size_local;
  uint8_t *provide_data_local;
  uint32_t provide_data_offset_local;
  apx_nodeInstance_t *self_local;
  
  provide_port_id = 0;
  if (self->connector_table == (apx_portConnectorList_t *)0x0) {
    __assert_fail("self->connector_table != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/node_instance.c"
                  ,0x5f5,
                  "apx_error_t route_provide_port_data_change_to_receivers(apx_nodeInstance_t *, uint32_t, const uint8_t *, apx_size_t)"
                 );
  }
  if (self->byte_port_map == (apx_bytePortMap_t *)0x0) {
    __assert_fail("self->byte_port_map != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/node_instance.c"
                  ,0x5f6,
                  "apx_error_t route_provide_port_data_change_to_receivers(apx_nodeInstance_t *, uint32_t, const uint8_t *, apx_size_t)"
                 );
  }
  pthread_mutex_lock((pthread_mutex_t *)&self->lock);
  _retval = provide_data;
  provide_data_local._4_4_ = provide_data_offset;
  do {
    if (provide_data_offset + provide_data_size <= provide_data_local._4_4_) {
LAB_0013d944:
      pthread_mutex_unlock((pthread_mutex_t *)&self->lock);
      return provide_port_id;
    }
    port_id = apx_bytePortMap_lookup(self->byte_port_map,provide_data_local._4_4_);
    if (port_id == 0xffffffff) {
      fprintf(_stderr,"[APX_NODE_INSTANCE] blocked write on invalid offset %u\n",
              (ulong)provide_data_local._4_4_);
      provide_port_id = 0x35;
      goto LAB_0013d944;
    }
    if (self->num_provide_ports < port_id) {
      fprintf(_stderr,"[APX_NODE_INSTANCE] Invalid port id detected in bytePortMap: %u\n",
              (ulong)port_id);
      provide_port_id = 6;
    }
    self_00 = apx_nodeInstance_get_provide_port(self,port_id);
    if (self_00 == (apx_portInstance_t *)0x0) {
      fprintf(_stderr,"[APX_NODE_INSTANCE] Invalid port id detected in bytePortMap: %u\n",
              (ulong)port_id);
      provide_port_id = 6;
    }
    else {
      size = apx_portInstance_data_size(self_00);
      if (size == 0) {
        __assert_fail("provide_port_data_size > 0u",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/node_instance.c"
                      ,0x60f,
                      "apx_error_t route_provide_port_data_change_to_receivers(apx_nodeInstance_t *, uint32_t, const uint8_t *, apx_size_t)"
                     );
      }
      paVar1 = self->connector_table;
      iVar2 = apx_portConnectorList_length(paVar1 + port_id);
      for (local_48 = 0; local_48 < iVar2; local_48 = local_48 + 1) {
        self_01 = apx_portConnectorList_get(paVar1 + port_id,local_48);
        if ((self_01 == (apx_portInstance_t *)0x0) ||
           (self_01->parent == (apx_nodeInstance_tag *)0x0)) {
          __assert_fail("(require_port != NULL) && (require_port->parent != NULL)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/node_instance.c"
                        ,0x615,
                        "apx_error_t route_provide_port_data_change_to_receivers(apx_nodeInstance_t *, uint32_t, const uint8_t *, apx_size_t)"
                       );
        }
        uVar3 = apx_portInstance_queue_length(self_00);
        if (uVar3 == 0) {
          uVar3 = apx_portInstance_data_size(self_01);
          if (size == uVar3) {
            uVar3 = apx_portInstance_data_offset(self_01);
            provide_port_id = remote_route_require_port_data(self_01->parent,uVar3,_retval,size);
          }
          else {
            provide_port_id = 0x46;
          }
        }
        else {
          provide_port_id = 0xb;
        }
      }
      provide_data_local._4_4_ = size + provide_data_local._4_4_;
      _retval = _retval + size;
    }
  } while( true );
}

Assistant:

static apx_error_t route_provide_port_data_change_to_receivers(apx_nodeInstance_t* self, uint32_t provide_data_offset, const uint8_t* provide_data, apx_size_t provide_data_size)
{
   apx_error_t retval = APX_NO_ERROR;
   uint32_t end_offset = provide_data_offset + provide_data_size;
   assert(self->connector_table != NULL);
   assert(self->byte_port_map != NULL);
   MUTEX_LOCK(self->lock);
   while (provide_data_offset < end_offset)
   {
      apx_portId_t provide_port_id;
      apx_portInstance_t* provide_port = NULL;
      provide_port_id = apx_bytePortMap_lookup(self->byte_port_map, provide_data_offset);
      if (provide_port_id == APX_INVALID_PORT_ID)
      {
         fprintf(stderr, "[APX_NODE_INSTANCE] blocked write on invalid offset %u\n", provide_data_offset);
         retval = APX_INVALID_WRITE_ERROR;
         break;
      }
      else if (provide_port_id > self->num_provide_ports)
      {
         fprintf(stderr, "[APX_NODE_INSTANCE] Invalid port id detected in bytePortMap: %u\n", (unsigned int)provide_port_id);
         retval = APX_INTERNAL_ERROR;
      }
      provide_port = apx_nodeInstance_get_provide_port(self, provide_port_id);
      if (provide_port != NULL)
      {
         apx_portConnectorList_t* port_connectors;
         int32_t num_connectors;
         int32_t connector_id;
         apx_size_t provide_port_data_size = apx_portInstance_data_size(provide_port);
         assert(provide_port_data_size > 0u);
         port_connectors = &self->connector_table[provide_port_id];
         num_connectors = apx_portConnectorList_length(port_connectors);
         for (connector_id = 0; connector_id < num_connectors; connector_id++)
         {
            apx_portInstance_t* require_port = apx_portConnectorList_get(port_connectors, connector_id);
            assert( (require_port != NULL) && (require_port->parent != NULL));
            if (apx_portInstance_queue_length(provide_port) == 0u)
            {
               apx_size_t require_port_data_size = apx_portInstance_data_size(require_port);
               if (provide_port_data_size != require_port_data_size)
               {
                  retval = APX_VALUE_LENGTH_ERROR;
               }
               else
               {
                  apx_size_t require_data_offset = apx_portInstance_data_offset(require_port);
                  retval = remote_route_require_port_data(require_port->parent, require_data_offset, provide_data, provide_port_data_size);
               }
            }
            else
            {
               retval = APX_NOT_IMPLEMENTED_ERROR;
            }
         }
         provide_data_offset += provide_port_data_size;
         provide_data += provide_port_data_size;
      }
      else
      {
         fprintf(stderr, "[APX_NODE_INSTANCE] Invalid port id detected in bytePortMap: %u\n", (unsigned int)provide_port_id);
         retval = APX_INTERNAL_ERROR;
      }
   }
   MUTEX_UNLOCK(self->lock);
   return retval;
}